

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

string * google::protobuf::anon_unknown_24::ValueOutOfRange<int>
                   (string_view type_name,string_view option_name)

{
  string *in_RDI;
  int local_40 [2];
  FormatSpec<int,_int,_std::basic_string_view<char>,_std::basic_string_view<char>_> local_38;
  basic_string_view<char,_std::char_traits<char>_> local_28;
  basic_string_view<char,_std::char_traits<char>_> local_18;
  
  local_38.super_type.spec_.data_ = "Value out of range, %d to %d, for %s option \"%s\".";
  local_38.super_type.spec_.size_ = 0x31;
  local_40[1] = 0x80000000;
  local_40[0] = 0x7fffffff;
  absl::lts_20250127::
  StrFormat<int,_int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (in_RDI,&local_38,local_40 + 1,local_40,&local_18,&local_28);
  return in_RDI;
}

Assistant:

std::string ValueOutOfRange(absl::string_view type_name,
                            absl::string_view option_name) {
  return absl::StrFormat("Value out of range, %d to %d, for %s option \"%s\".",
                         std::numeric_limits<T>::min(),
                         std::numeric_limits<T>::max(), type_name, option_name);
}